

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O1

double __thiscall
units::detail::otherUsefulConversions<units::precise_unit,units::precise_unit>
          (detail *this,double val,precise_unit *start,precise_unit *result)

{
  bool bVar1;
  uint uVar2;
  unit_data uVar3;
  unit_data uVar4;
  precise_unit *result_00;
  units *this_00;
  float fVar5;
  double dVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  unit_data local_28;
  unit_data local_24;
  unit local_20;
  
  if ((((uint)start->base_units_ ^ (uint)*(unit_data *)(this + 8)) & 0x700) == 0) {
    local_28 = start->base_units_;
    local_24 = *(unit_data *)(this + 8);
    uVar3 = unit_data::operator/(&local_24,&local_28);
    fVar5 = power_const<float>(1.0,2);
    unit_data::pow((unit_data *)((long)&s + 4),(double)CONCAT44(extraout_XMM0_Db,fVar5),in_XMM1_Qa);
    local_20.multiplier_ = fVar5;
    uVar4 = unit_data::operator/((unit_data *)((long)&m + 4),&local_20.base_units_);
    if ((((uint)uVar4 ^ (uint)uVar3) & 0xfffffff) == 0) {
      dVar6 = (val * *(double *)this) / 9.80665;
    }
    else {
      local_24 = start->base_units_;
      local_28 = *(unit_data *)(this + 8);
      uVar3 = unit_data::operator/(&local_24,&local_28);
      fVar5 = power_const<float>(1.0,2);
      unit_data::pow((unit_data *)((long)&s + 4),(double)CONCAT44(extraout_XMM0_Db_00,fVar5),
                     in_XMM1_Qa);
      local_20.multiplier_ = fVar5;
      uVar4 = unit_data::operator/((unit_data *)((long)&m + 4),&local_20.base_units_);
      if ((((uint)uVar4 ^ (uint)uVar3) & 0xfffffff) != 0) goto LAB_00122bf0;
      dVar6 = val * *(double *)this * 9.80665;
    }
    dVar6 = dVar6 / start->multiplier_;
  }
  else {
LAB_00122bf0:
    local_20.multiplier_ = (float)*(double *)this;
    local_20.base_units_ = *(unit_data *)(this + 8);
    bVar1 = unit::operator==(&local_20,(unit *)&kilo);
    dVar6 = NAN;
    if (bVar1) {
      uVar2 = (uint)start->base_units_ & 0xfffffff;
      if (uVar2 == 0x100) {
        this_00 = (units *)&kg;
      }
      else {
        if (uVar2 != 1) {
          return NAN;
        }
        this_00 = (units *)&km;
      }
      dVar6 = convert<units::unit,units::precise_unit>(this_00,val,(unit *)start,result_00);
    }
  }
  return dVar6;
}

Assistant:

inline double
        otherUsefulConversions(double val, const UX& start, const UX2& result)
    {
        if (start.base_units().kg() == result.base_units().kg()) {
            if ((start.base_units() / result.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // weight to mass
                return val * start.multiplier() / constants::standard_gravity /
                    result.multiplier();
            }
            if ((result.base_units() / start.base_units())
                    .has_same_base((m / s.pow(2)).base_units())) {
                // mass to weight
                return val * start.multiplier() * constants::standard_gravity /
                    result.multiplier();
            }
        }
        if (unit_cast(start) == kilo) {
            if (result.has_same_base(kg)) {
                return convert(val, kg, result);
            }
            if (result.has_same_base(m)) {
                return convert(val, km, result);
            }
        }
        return constants::invalid_conversion;
    }